

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

char * Wlc_PrsFindRange(char *pStr,int *End,int *Beg)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int *Beg_local;
  int *End_local;
  char *pStr_local;
  
  *Beg = 0;
  *End = 0;
  pStr_local = Wlc_PrsSkipSpaces(pStr);
  if (*pStr_local == '[') {
    pcVar2 = Wlc_PrsSkipSpaces(pStr_local + 1);
    iVar1 = Wlc_PrsIsDigit(pcVar2);
    if (iVar1 == 0) {
      pStr_local = (char *)0x0;
    }
    else {
      iVar1 = atoi(pcVar2);
      *Beg = iVar1;
      *End = iVar1;
      pcVar3 = Wlc_PrsFindSymbol(pcVar2,':');
      if (pcVar3 == (char *)0x0) {
        End_local = (int *)Wlc_PrsFindSymbol(pcVar2,']');
        if (End_local == (int *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        pcVar2 = Wlc_PrsFindSymbol(pcVar2,':');
        pcVar2 = Wlc_PrsSkipSpaces(pcVar2 + 1);
        iVar1 = Wlc_PrsIsDigit(pcVar2);
        if (iVar1 == 0) {
          return (char *)0x0;
        }
        iVar1 = atoi(pcVar2);
        *Beg = iVar1;
        End_local = (int *)Wlc_PrsFindSymbol(pcVar2,']');
        if (End_local == (int *)0x0) {
          return (char *)0x0;
        }
      }
      if (*End < *Beg) {
        pStr_local = (char *)0x0;
      }
      else {
        if (*End < *Beg) {
          __assert_fail("*End >= *Beg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                        ,0x1f2,"char *Wlc_PrsFindRange(char *, int *, int *)");
        }
        pStr_local = (char *)((long)End_local + 1);
      }
    }
  }
  return pStr_local;
}

Assistant:

static inline char * Wlc_PrsFindRange( char * pStr, int * End, int * Beg )
{
    *End = *Beg = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( pStr[0] != '[' )
        return pStr;
    pStr = Wlc_PrsSkipSpaces( pStr+1 );
    if ( !Wlc_PrsIsDigit(pStr) )
        return NULL;
    *End = *Beg = atoi( pStr );
    if ( Wlc_PrsFindSymbol( pStr, ':' ) == NULL )
    {
        pStr = Wlc_PrsFindSymbol( pStr, ']' );
        if ( pStr == NULL )
            return NULL;
    }
    else
    {
        pStr = Wlc_PrsFindSymbol( pStr, ':' );
        pStr = Wlc_PrsSkipSpaces( pStr+1 );
        if ( !Wlc_PrsIsDigit(pStr) )
            return NULL;
        *Beg = atoi( pStr );
        pStr = Wlc_PrsFindSymbol( pStr, ']' );
        if ( pStr == NULL )
            return NULL;
    }
    if ( *End < *Beg )
        return NULL;
    assert( *End >= *Beg );
    return pStr + 1;
}